

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O1

void EndShaderMode(void)

{
  uint uVar1;
  int *piVar2;
  
  piVar2 = RLGL.State.defaultShaderLocs;
  uVar1 = RLGL.State.defaultShaderId;
  if (RLGL.State.currentShaderId != RLGL.State.defaultShaderId) {
    rlDrawRenderBatch(RLGL.currentBatch);
    RLGL.State.currentShaderId = uVar1;
    RLGL.State.currentShaderLocs = piVar2;
  }
  return;
}

Assistant:

void EndShaderMode(void)
{
    rlSetShader(rlGetShaderIdDefault(), rlGetShaderLocsDefault());
}